

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void processCompileOptionsInternal
               (cmTarget *tgt,
               vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *options,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueOptions,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugOptions,char *logName,string *language)

{
  vector<cmListFileContext,_std::allocator<cmListFileContext>_> *__x;
  char *pcVar1;
  long *plVar2;
  cmake *this;
  undefined8 *puVar3;
  pointer pcVar4;
  ulong *puVar5;
  long *plVar6;
  size_type *psVar7;
  pointer __obj;
  ulong uVar8;
  undefined7 in_stack_00000009;
  string *in_stack_00000020;
  pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  __p;
  string usedOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryOptions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  long *local_178;
  undefined8 local_170;
  long local_168;
  undefined8 uStack_160;
  cmTarget *local_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined1 local_130 [24];
  cmState *pcStack_118;
  pointer pcStack_110;
  pointer local_108;
  _Alloc_hider local_100;
  long local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  ulong *local_e0;
  long local_d8;
  ulong local_d0 [2];
  cmMakefile *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  long *local_60 [2];
  long local_50 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  cmGeneratorExpressionDAGChecker *local_38;
  
  if (entries !=
      (vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
       *)options) {
    local_c0 = tgt->Makefile;
    local_158 = tgt;
    local_40 = options;
    local_38 = (cmGeneratorExpressionDAGChecker *)config;
    do {
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)((*(pointer *)entries)->_M_dataplus)._M_p
                          ,local_c0,(string *)CONCAT71(in_stack_00000009,debugOptions),false,
                          local_158,local_38,in_stack_00000020);
      std::__cxx11::string::string((string *)local_130,pcVar1,(allocator *)&local_100);
      cmSystemTools::ExpandListArgument((string *)local_130,&local_78,false);
      if ((pointer)local_130._0_8_ != (pointer)(local_130 + 0x10)) {
        operator_delete((void *)local_130._0_8_,
                        (ulong)((long)&(((string *)local_130._16_8_)->_M_dataplus)._M_p + 1));
      }
      local_f8 = 0;
      local_f0._M_local_buf[0] = '\0';
      __obj = local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_100._M_p = (pointer)&local_f0;
      if (local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::resize((hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                    *)dagChecker,*(long *)((long)&(dagChecker->Target).field_2 + 8) + 1);
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::insert_unique_noresize
                    ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                      *)local_130,
                     (hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                      *)dagChecker,__obj);
          if (local_130[0x10] == '\x01') {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)uniqueOptions,__obj);
            if ((char)logName != '\0') {
              std::operator+(&local_198," * ",__obj);
              plVar2 = (long *)std::__cxx11::string::append((char *)&local_198);
              local_130._0_8_ = local_130 + 0x10;
              pcVar4 = (pointer)(plVar2 + 2);
              if ((pointer)*plVar2 == pcVar4) {
                local_130._16_8_ = (pcVar4->Name)._M_dataplus._M_p;
                pcStack_118 = (cmState *)plVar2[3];
              }
              else {
                local_130._16_8_ = (pcVar4->Name)._M_dataplus._M_p;
                local_130._0_8_ = (pointer)*plVar2;
              }
              local_130._8_8_ = plVar2[1];
              *plVar2 = (long)pcVar4;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_100,local_130._0_8_);
              if ((pointer)local_130._0_8_ != (pointer)(local_130 + 0x10)) {
                operator_delete((void *)local_130._0_8_,
                                (ulong)((long)&(((string *)local_130._16_8_)->_M_dataplus)._M_p + 1)
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p,
                                local_198.field_2._M_allocated_capacity + 1);
              }
            }
          }
          __obj = __obj + 1;
        } while (__obj != local_78.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        if (local_f8 != 0) {
          this = cmMakefile::GetCMakeInstance(local_c0);
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Used compile ","");
          plVar2 = (long *)std::__cxx11::string::append((char *)local_60);
          local_150 = &local_140;
          puVar5 = (ulong *)(plVar2 + 2);
          if ((ulong *)*plVar2 == puVar5) {
            local_140 = *puVar5;
            uStack_138 = (undefined4)plVar2[3];
            uStack_134 = *(undefined4 *)((long)plVar2 + 0x1c);
          }
          else {
            local_140 = *puVar5;
            local_150 = (ulong *)*plVar2;
          }
          local_148 = plVar2[1];
          *plVar2 = (long)puVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          local_e0 = local_d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0," for target ","");
          uVar8 = 0xf;
          if (local_150 != &local_140) {
            uVar8 = local_140;
          }
          if (uVar8 < (ulong)(local_d8 + local_148)) {
            uVar8 = 0xf;
            if (local_e0 != local_d0) {
              uVar8 = local_d0[0];
            }
            if (uVar8 < (ulong)(local_d8 + local_148)) goto LAB_0031c6b8;
            puVar3 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_150);
          }
          else {
LAB_0031c6b8:
            puVar3 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_e0);
          }
          local_178 = &local_168;
          plVar2 = puVar3 + 2;
          if ((long *)*puVar3 == plVar2) {
            local_168 = *plVar2;
            uStack_160 = puVar3[3];
          }
          else {
            local_168 = *plVar2;
            local_178 = (long *)*puVar3;
          }
          local_170 = puVar3[1];
          *puVar3 = plVar2;
          puVar3[1] = 0;
          *(undefined1 *)plVar2 = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_178,(ulong)(local_158->Name)._M_dataplus._M_p);
          local_b8 = &local_a8;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_a8 = *plVar6;
            lStack_a0 = plVar2[3];
          }
          else {
            local_a8 = *plVar6;
            local_b8 = (long *)*plVar2;
          }
          local_b0 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_98 = &local_88;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_88 = *plVar6;
            lStack_80 = plVar2[3];
          }
          else {
            local_88 = *plVar6;
            local_98 = (long *)*plVar2;
          }
          local_90 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_100._M_p);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          psVar7 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_198.field_2._M_allocated_capacity = *psVar7;
            local_198.field_2._8_8_ = plVar2[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *psVar7;
            local_198._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_198._M_string_length = plVar2[1];
          *plVar2 = (long)psVar7;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          __x = (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)
                ((*(pointer *)entries)->_M_dataplus)._M_p;
          std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::vector
                    ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_130,__x)
          ;
          local_108 = __x[1].
                      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          pcStack_118 = (cmState *)
                        __x[1].
                        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          pcStack_110 = __x[1].
                        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          cmake::IssueMessage(this,LOG,&local_198,(cmListFileBacktrace *)local_130);
          std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                    ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,local_168 + 1);
          }
          if (local_e0 != local_d0) {
            operator_delete(local_e0,local_d0[0] + 1);
          }
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if (local_60[0] != local_50) {
            operator_delete(local_60[0],local_50[0] + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_p != &local_f0) {
        operator_delete(local_100._M_p,
                        CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1)
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      entries = (vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                 *)((long)entries + 8);
    } while (entries !=
             (vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              *)local_40);
  }
  return;
}

Assistant:

static void processCompileOptionsInternal(cmTarget const* tgt,
      const std::vector<cmTargetInternals::TargetPropertyEntry*> &entries,
      std::vector<std::string> &options,
      UNORDERED_SET<std::string> &uniqueOptions,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugOptions, const char *logName,
      std::string const& language)
{
  cmMakefile *mf = tgt->GetMakefile();

  for (std::vector<cmTargetInternals::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    std::vector<std::string> entryOptions;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(mf,
                                              config,
                                              false,
                                              tgt,
                                              dagChecker,
                                              language),
                                    entryOptions);
    std::string usedOptions;
    for(std::vector<std::string>::iterator
          li = entryOptions.begin(); li != entryOptions.end(); ++li)
      {
      std::string const& opt = *li;

      if(uniqueOptions.insert(opt).second)
        {
        options.push_back(opt);
        if (debugOptions)
          {
          usedOptions += " * " + opt + "\n";
          }
        }
      }
    if (!usedOptions.empty())
      {
      mf->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used compile ") + logName
                            + std::string(" for target ")
                            + tgt->GetName() + ":\n"
                            + usedOptions, (*it)->ge->GetBacktrace());
      }
    }
}